

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_highbd_dr_prediction_z1_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  long lVar10;
  byte bVar11;
  int i;
  int iVar12;
  int iVar13;
  uint16_t uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar40 [16];
  
  bVar11 = (byte)upsample_above;
  iVar13 = bw + bh + -1 << (bVar11 & 0x1f);
  if (0 < bh) {
    lVar16 = (long)iVar13;
    iVar12 = 0;
    iVar18 = dx;
    do {
      auVar8 = _DAT_004cbd30;
      auVar7 = _DAT_004cbd20;
      auVar6 = _DAT_004ca150;
      auVar5 = _DAT_004ca140;
      auVar4 = _DAT_004ca130;
      iVar9 = iVar18 >> (6 - bVar11 & 0x1f);
      if (iVar13 <= iVar9) {
        if (bh <= iVar12) {
          return;
        }
        lVar10 = (long)bw + -1;
        auVar19._8_4_ = (int)lVar10;
        auVar19._0_8_ = lVar10;
        auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar19 = auVar19 ^ _DAT_004ca150;
        do {
          if (bw != 0) {
            uVar14 = above[lVar16];
            uVar15 = 0;
            do {
              auVar30._8_4_ = (int)uVar15;
              auVar30._0_8_ = uVar15;
              auVar30._12_4_ = (int)(uVar15 >> 0x20);
              auVar22 = (auVar30 | auVar5) ^ auVar6;
              iVar13 = auVar19._0_4_;
              iVar35 = -(uint)(iVar13 < auVar22._0_4_);
              iVar18 = auVar19._4_4_;
              auVar23._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
              iVar9 = auVar19._8_4_;
              iVar37 = -(uint)(iVar9 < auVar22._8_4_);
              iVar20 = auVar19._12_4_;
              auVar23._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
              auVar32._4_4_ = iVar35;
              auVar32._0_4_ = iVar35;
              auVar32._8_4_ = iVar37;
              auVar32._12_4_ = iVar37;
              auVar38 = pshuflw(in_XMM11,auVar32,0xe8);
              auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
              auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
              auVar25._0_4_ = auVar25._4_4_;
              auVar25._8_4_ = auVar25._12_4_;
              auVar40 = pshuflw(in_XMM12,auVar25,0xe8);
              auVar23._0_4_ = auVar23._4_4_;
              auVar23._8_4_ = auVar23._12_4_;
              auVar39 = pshuflw(auVar38,auVar23,0xe8);
              auVar22._8_4_ = 0xffffffff;
              auVar22._0_8_ = 0xffffffffffffffff;
              auVar22._12_4_ = 0xffffffff;
              auVar22 = (auVar39 | auVar40 & auVar38) ^ auVar22;
              auVar22 = packssdw(auVar22,auVar22);
              if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dst[uVar15] = uVar14;
              }
              auVar23 = auVar25 & auVar32 | auVar23;
              auVar22 = packssdw(auVar23,auVar23);
              auVar39._8_4_ = 0xffffffff;
              auVar39._0_8_ = 0xffffffffffffffff;
              auVar39._12_4_ = 0xffffffff;
              auVar22 = packssdw(auVar22 ^ auVar39,auVar22 ^ auVar39);
              if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
                dst[uVar15 + 1] = uVar14;
              }
              auVar22 = (auVar30 | auVar4) ^ auVar6;
              iVar35 = -(uint)(iVar13 < auVar22._0_4_);
              auVar36._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
              iVar37 = -(uint)(iVar9 < auVar22._8_4_);
              auVar36._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
              auVar24._4_4_ = iVar35;
              auVar24._0_4_ = iVar35;
              auVar24._8_4_ = iVar37;
              auVar24._12_4_ = iVar37;
              auVar31._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
              auVar31._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              auVar22 = auVar31 & auVar24 | auVar36;
              auVar22 = packssdw(auVar22,auVar22);
              auVar1._8_4_ = 0xffffffff;
              auVar1._0_8_ = 0xffffffffffffffff;
              auVar1._12_4_ = 0xffffffff;
              auVar22 = packssdw(auVar22 ^ auVar1,auVar22 ^ auVar1);
              if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                dst[uVar15 + 2] = uVar14;
              }
              auVar25 = pshufhw(auVar24,auVar24,0x84);
              auVar32 = pshufhw(auVar31,auVar31,0x84);
              auVar23 = pshufhw(auVar25,auVar36,0x84);
              auVar26._8_4_ = 0xffffffff;
              auVar26._0_8_ = 0xffffffffffffffff;
              auVar26._12_4_ = 0xffffffff;
              auVar26 = (auVar23 | auVar32 & auVar25) ^ auVar26;
              auVar25 = packssdw(auVar26,auVar26);
              if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                dst[uVar15 + 3] = uVar14;
              }
              auVar25 = (auVar30 | auVar8) ^ auVar6;
              iVar35 = -(uint)(iVar13 < auVar25._0_4_);
              auVar28._4_4_ = -(uint)(iVar18 < auVar25._4_4_);
              iVar37 = -(uint)(iVar9 < auVar25._8_4_);
              auVar28._12_4_ = -(uint)(iVar20 < auVar25._12_4_);
              auVar33._4_4_ = iVar35;
              auVar33._0_4_ = iVar35;
              auVar33._8_4_ = iVar37;
              auVar33._12_4_ = iVar37;
              auVar22 = pshuflw(auVar22,auVar33,0xe8);
              auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar18);
              auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar20);
              auVar27._0_4_ = auVar27._4_4_;
              auVar27._8_4_ = auVar27._12_4_;
              auVar25 = pshuflw(auVar40 & auVar38,auVar27,0xe8);
              in_XMM12 = auVar25 & auVar22;
              auVar28._0_4_ = auVar28._4_4_;
              auVar28._8_4_ = auVar28._12_4_;
              auVar22 = pshuflw(auVar22,auVar28,0xe8);
              auVar38._8_4_ = 0xffffffff;
              auVar38._0_8_ = 0xffffffffffffffff;
              auVar38._12_4_ = 0xffffffff;
              auVar38 = (auVar22 | in_XMM12) ^ auVar38;
              in_XMM11 = packssdw(auVar38,auVar38);
              if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dst[uVar15 + 4] = uVar14;
              }
              auVar28 = auVar27 & auVar33 | auVar28;
              auVar22 = packssdw(auVar28,auVar28);
              auVar40._8_4_ = 0xffffffff;
              auVar40._0_8_ = 0xffffffffffffffff;
              auVar40._12_4_ = 0xffffffff;
              auVar22 = packssdw(auVar22 ^ auVar40,auVar22 ^ auVar40);
              if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                dst[uVar15 + 5] = uVar14;
              }
              auVar22 = (auVar30 | auVar7) ^ auVar6;
              iVar13 = -(uint)(iVar13 < auVar22._0_4_);
              auVar34._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
              iVar9 = -(uint)(iVar9 < auVar22._8_4_);
              auVar34._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
              auVar29._4_4_ = iVar13;
              auVar29._0_4_ = iVar13;
              auVar29._8_4_ = iVar9;
              auVar29._12_4_ = iVar9;
              auVar21._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
              auVar21._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
              auVar21._0_4_ = auVar21._4_4_;
              auVar21._8_4_ = auVar21._12_4_;
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar22 = auVar21 & auVar29 | auVar34;
              auVar22 = packssdw(auVar22,auVar22);
              auVar2._8_4_ = 0xffffffff;
              auVar2._0_8_ = 0xffffffffffffffff;
              auVar2._12_4_ = 0xffffffff;
              auVar22 = packssdw(auVar22 ^ auVar2,auVar22 ^ auVar2);
              if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                dst[uVar15 + 6] = uVar14;
              }
              auVar30 = pshufhw(auVar29,auVar29,0x84);
              auVar22 = pshufhw(auVar21,auVar21,0x84);
              auVar25 = pshufhw(auVar30,auVar34,0x84);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar22 = packssdw(auVar22 & auVar30,(auVar25 | auVar22 & auVar30) ^ auVar3);
              if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                dst[uVar15 + 7] = uVar14;
              }
              uVar15 = uVar15 + 8;
            } while (((long)bw + 7U & 0xfffffffffffffff8) != uVar15);
          }
          iVar12 = iVar12 + 1;
          dst = dst + stride;
        } while (iVar12 != bh);
        return;
      }
      if (0 < bw) {
        uVar17 = (uint)(iVar18 << (bVar11 & 0x1f)) >> 1 & 0x1f;
        lVar10 = (long)iVar9;
        uVar15 = 0;
        do {
          if (lVar10 < lVar16) {
            uVar14 = (uint16_t)
                     ((uint)above[lVar10] * (0x20 - uVar17) + above[lVar10 + 1] * uVar17 + 0x10 >> 5
                     );
          }
          else {
            uVar14 = above[lVar16];
          }
          dst[uVar15] = uVar14;
          uVar15 = uVar15 + 1;
          lVar10 = lVar10 + (1 << (bVar11 & 0x1f));
        } while ((uint)bw != uVar15);
      }
      iVar12 = iVar12 + 1;
      iVar18 = iVar18 + dx;
      dst = dst + stride;
    } while (iVar12 != bh);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z1_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_above,
                                   int dx, int dy, int bd) {
  int r, c, x, base, shift, val;

  (void)left;
  (void)dy;
  (void)bd;
  assert(dy == 1);
  assert(dx > 0);

  const int max_base_x = ((bw + bh) - 1) << upsample_above;
  const int frac_bits = 6 - upsample_above;
  const int base_inc = 1 << upsample_above;
  x = dx;
  for (r = 0; r < bh; ++r, dst += stride, x += dx) {
    base = x >> frac_bits;
    shift = ((x << upsample_above) & 0x3F) >> 1;

    if (base >= max_base_x) {
      for (int i = r; i < bh; ++i) {
        aom_memset16(dst, above[max_base_x], bw);
        dst += stride;
      }
      return;
    }

    for (c = 0; c < bw; ++c, base += base_inc) {
      if (base < max_base_x) {
        val = above[base] * (32 - shift) + above[base + 1] * shift;
        dst[c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        dst[c] = above[max_base_x];
      }
    }
  }
}